

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O3

uint32_t __thiscall SQASTWritingVisitor::writeString(SQASTWritingVisitor *this,SQChar *s)

{
  OutputStream *pOVar1;
  ArenaVector<const_char_*> *pAVar2;
  bool bVar3;
  uint uVar4;
  iterator iVar5;
  char **__dest;
  mapped_type *pmVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  SQChar *local_38;
  
  local_38 = s;
  iVar5 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->stringTable,&local_38);
  if (iVar5.super__Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    pAVar2 = this->stringIndexes;
    uVar7 = pAVar2->_size;
    uVar8 = (ulong)uVar7;
    if (uVar7 < pAVar2->_allocated) {
      __dest = pAVar2->_vals;
      uVar4 = uVar7;
    }
    else {
      uVar9 = 4;
      if (uVar7 * 2 != 0) {
        uVar9 = (ulong)(uVar7 * 2);
      }
      __dest = (char **)Arena::allocate(pAVar2->_arena,uVar9 * 8);
      memcpy(__dest,pAVar2->_vals,(ulong)pAVar2->_size << 3);
      pAVar2->_vals = __dest;
      pAVar2->_allocated = (size_type_conflict)uVar9;
      uVar4 = pAVar2->_size;
    }
    pAVar2->_size = uVar4 + 1;
    __dest[uVar4] = local_38;
    pmVar6 = std::__detail::
             _Map_base<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->stringTable,&local_38);
    *pmVar6 = uVar7;
    pOVar1 = this->stream;
    uVar9 = uVar8;
    if (0x7f < uVar7) {
      do {
        (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar8 | 0x80));
        uVar9 = uVar8 >> 7;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    (**pOVar1->_vptr_OutputStream)(pOVar1,uVar9 & 0xff);
  }
  else {
    pOVar1 = this->stream;
    uVar8 = (ulong)*(uint *)((long)iVar5.
                                   super__Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true>
                                   ._M_cur + 0x10);
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar8 | 0x80));
        uVar9 = uVar8 >> 7;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    (**pOVar1->_vptr_OutputStream)(pOVar1,uVar9 & 0xff);
    uVar7 = *(uint *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true>
                            ._M_cur + 0x10);
  }
  return uVar7;
}

Assistant:

uint32_t SQASTWritingVisitor::writeString(const SQChar *s) {
  auto it = stringTable.find(s);

  if (it != stringTable.end()) {
    stream->writeUInt32(it->second);
    return it->second;
  }

  unsigned idx = stringIndexes.size();
  stringIndexes.push_back(s);
  stringTable[s] = idx;

  stream->writeUInt32(idx);
  return idx;
}